

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii.h
# Opt level: O0

string_view absl::lts_20250127::StripAsciiWhitespace(string_view str)

{
  char *in_RDX;
  string_view sVar1;
  string_view str_local;
  
  sVar1._M_len = str._M_str;
  sVar1._M_str = in_RDX;
  sVar1 = StripLeadingAsciiWhitespace((lts_20250127 *)str._M_len,sVar1);
  sVar1 = StripTrailingAsciiWhitespace(sVar1);
  return sVar1;
}

Assistant:

ABSL_MUST_USE_RESULT inline absl::string_view StripAsciiWhitespace(
    absl::string_view str) {
  return StripTrailingAsciiWhitespace(StripLeadingAsciiWhitespace(str));
}